

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  LogMessage *other;
  LogFinisher local_72;
  byte local_71;
  LogMessage local_70;
  mapped_type *local_38;
  vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
  *trees;
  ParseInfoTree *local_20;
  ParseInfoTree *instance;
  FieldDescriptor *field_local;
  ParseInfoTree *this_local;
  
  instance = (ParseInfoTree *)field;
  field_local = (FieldDescriptor *)this;
  this_00 = (ParseInfoTree *)operator_new(0x60);
  ParseInfoTree(this_00);
  local_20 = this_00;
  local_38 = std::
             map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>_>_>
             ::operator[](&this->nested_,(key_type *)&instance);
  local_71 = 0;
  if (local_38 == (mapped_type *)0x0) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x92);
    local_71 = 1;
    other = internal::LogMessage::operator<<(&local_70,"CHECK failed: trees: ");
    internal::LogFinisher::operator=(&local_72,other);
  }
  if ((local_71 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_70);
  }
  std::
  vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
  ::push_back(local_38,&local_20);
  return local_20;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  TextFormat::ParseInfoTree* instance = new TextFormat::ParseInfoTree();
  std::vector<TextFormat::ParseInfoTree*>* trees = &nested_[field];
  GOOGLE_CHECK(trees);
  trees->push_back(instance);
  return instance;
}